

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O0

void test_compat_zip_7(void)

{
  archive *a_00;
  archive *v2;
  void *unaff_retaddr;
  int i;
  size_t s;
  void *p;
  archive_entry *ae;
  archive *a;
  char *refname;
  char *in_stack_000003e0;
  archive *in_stack_ffffffffffffffc8;
  archive *paVar1;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  wchar_t in_stack_ffffffffffffffd8;
  wchar_t in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe8;
  char *_a;
  
  _a = "test_compat_zip_7.xps";
  extract_reference_file(in_stack_000003e0);
  a_00 = (archive *)slurpfile((size_t *)&stack0xffffffffffffffd8,_a);
  for (iVar2 = 1; iVar2 < 1000; iVar2 = iVar2 + 1) {
    v2 = archive_read_new();
    assertion_assert((char *)a_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                     (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    archive_read_support_format_zip(in_stack_ffffffffffffffc8);
    paVar1 = v2;
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x149732,unaff_retaddr);
    read_open_memory_minimal
              (a_00,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               CONCAT44(iVar2,in_stack_ffffffffffffffd0),(size_t)paVar1);
    paVar1 = v2;
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x14977a,unaff_retaddr);
    archive_read_next_header
              ((archive *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(archive_entry **)paVar1);
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x1497b8,unaff_retaddr);
    archive_read_data_skip((archive *)_a);
    paVar1 = v2;
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x1497f1,unaff_retaddr);
    archive_read_next_header
              ((archive *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(archive_entry **)paVar1);
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x14982f,unaff_retaddr);
    archive_read_data_skip((archive *)_a);
    paVar1 = v2;
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x149868,unaff_retaddr);
    archive_read_next_header
              ((archive *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(archive_entry **)paVar1);
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x1498a6,unaff_retaddr);
    archive_read_data_skip((archive *)_a);
    paVar1 = v2;
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x1498df,unaff_retaddr);
    archive_read_next_header
              ((archive *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(archive_entry **)paVar1);
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x14991d,unaff_retaddr);
    archive_read_data_skip((archive *)_a);
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x149956,unaff_retaddr);
    archive_read_free((archive *)0x149960);
    assertion_equal_int(in_stack_ffffffffffffffe8,(wchar_t)((ulong)a_00 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                        (char *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),(longlong)v2,
                        (char *)0x14998f,unaff_retaddr);
    in_stack_ffffffffffffffc8 = v2;
  }
  free(a_00);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_7)
{
	const char *refname = "test_compat_zip_7.xps";
	struct archive *a;
	struct archive_entry *ae;
	void *p;
	size_t s;
	int i;

	extract_reference_file(refname);
	p = slurpfile(&s, refname);

	for (i = 1; i < 1000; ++i) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
		assertEqualIntA(a, ARCHIVE_OK, read_open_memory_minimal(a, p, s, i));

		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));

		assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
	}
	free(p);
}